

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::FunctionMockerBase<test_result_(unsigned_int)>::FunctionMockerBase
          (FunctionMockerBase<test_result_(unsigned_int)> *this)

{
  UntypedFunctionMockerBase *in_RDI;
  FunctionMockerBase<test_result_(unsigned_int)> *in_stack_ffffffffffffffd8;
  
  UntypedFunctionMockerBase::UntypedFunctionMockerBase(in_RDI);
  in_RDI->_vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMockerBase_00266660;
  MockSpec<test_result_(unsigned_int)>::MockSpec
            ((MockSpec<test_result_(unsigned_int)> *)in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

FunctionMockerBase() : current_spec_(this) {}